

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_copy(jit_State *J,RecordFFData *rd)

{
  uint sp;
  CTState *cts_00;
  TRef trdst_00;
  TRef trsrc_00;
  TRef TVar1;
  TRef TVar2;
  TRef local_8c;
  TRef trlen;
  TRef trsrc;
  TRef trdst;
  CTState *cts;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  cts_00 = (CTState *)J[-1].penalty[0x3b].pc.ptr64;
  sp = J->base[1];
  TVar1 = J->base[2];
  if (((*J->base != 0) && (sp != 0)) && ((TVar1 != 0 || ((sp & 0x1f000000) == 0x4000000)))) {
    trdst_00 = crec_ct_tv(J,cts_00->tab + 0x11,0,*J->base,rd->argv);
    trsrc_00 = crec_ct_tv(J,cts_00->tab + 0x12,0,sp,rd->argv + 1);
    if (TVar1 == 0) {
      TVar1 = J->base[1];
      (J->fold).ins.field_0.ot = 0x4513;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = 0;
      TVar1 = lj_opt_fold(J);
      TVar2 = lj_ir_kint(J,1);
      (J->fold).ins.field_0.ot = 0x2913;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
      local_8c = lj_opt_fold(J);
    }
    else {
      local_8c = crec_toint(J,cts_00,TVar1,rd->argv + 2);
    }
    rd->nres = 0;
    crec_copy(J,trdst_00,trsrc_00,local_8c,(CType *)0x0);
  }
  return;
}

Assistant:

void LJ_FASTCALL recff_ffi_copy(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef trdst = J->base[0], trsrc = J->base[1], trlen = J->base[2];
  if (trdst && trsrc && (trlen || tref_isstr(trsrc))) {
    trdst = crec_ct_tv(J, ctype_get(cts, CTID_P_VOID), 0, trdst, &rd->argv[0]);
    trsrc = crec_ct_tv(J, ctype_get(cts, CTID_P_CVOID), 0, trsrc, &rd->argv[1]);
    if (trlen) {
      trlen = crec_toint(J, cts, trlen, &rd->argv[2]);
    } else {
      trlen = emitir(IRTI(IR_FLOAD), J->base[1], IRFL_STR_LEN);
      trlen = emitir(IRTI(IR_ADD), trlen, lj_ir_kint(J, 1));
    }
    rd->nres = 0;
    crec_copy(J, trdst, trsrc, trlen, NULL);
  }  /* else: interpreter will throw. */
}